

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

void big2_updatePosition(ENCODING *enc,char *ptr,char *end,POSITION *pos)

{
  byte *pbVar1;
  byte bVar2;
  unsigned_long uVar3;
  undefined1 uVar4;
  bool bVar5;
  
  if (ptr != end) {
    uVar3 = pos->columnNumber;
    do {
      bVar2 = *ptr;
      if (bVar2 < 0xdc) {
        uVar4 = 7;
        if (3 < bVar2 - 0xd8) {
          if (bVar2 == 0) {
            uVar4 = *(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
          }
          else {
LAB_004d73cc:
            uVar4 = 0x1d;
          }
        }
      }
      else if (bVar2 - 0xdc < 4) {
        uVar4 = 8;
      }
      else {
        if ((bVar2 != 0xff) || (((byte *)ptr)[1] < 0xfe)) goto LAB_004d73cc;
        uVar4 = 0;
      }
      switch(uVar4) {
      default:
        ptr = (char *)((byte *)ptr + 2);
        break;
      case 6:
        ptr = (char *)((byte *)ptr + 3);
        break;
      case 7:
        ptr = (char *)((byte *)ptr + 4);
        break;
      case 9:
        pos->lineNumber = pos->lineNumber + 1;
        pbVar1 = (byte *)ptr + 2;
        if (pbVar1 != (byte *)end) {
          if (*pbVar1 == 0) {
            bVar5 = *(char *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]) == '\n';
          }
          else {
            bVar5 = false;
          }
          if (bVar5) {
            pbVar1 = (byte *)ptr + 4;
          }
        }
        ptr = (char *)pbVar1;
        pos->columnNumber = 0xffffffff;
        uVar3 = 0xffffffff;
        break;
      case 10:
        pos->columnNumber = 0xffffffff;
        pos->lineNumber = pos->lineNumber + 1;
        ptr = (char *)((byte *)ptr + 2);
        uVar3 = 0xffffffff;
      }
      uVar3 = uVar3 + 1;
      pos->columnNumber = uVar3;
    } while (ptr != end);
  }
  return;
}

Assistant:

static
void PREFIX(updatePosition)(const ENCODING *enc,
                            const char *ptr,
                            const char *end,
                            POSITION *pos)
{
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_LF:
      pos->columnNumber = (unsigned)-1;
      pos->lineNumber++;
      ptr += MINBPC(enc);
      break;
    case BT_CR:
      pos->lineNumber++;
      ptr += MINBPC(enc);
      if (ptr != end && BYTE_TYPE(enc, ptr) == BT_LF)
        ptr += MINBPC(enc);
      pos->columnNumber = (unsigned)-1;
      break;
    default:
      ptr += MINBPC(enc);
      break;
    }
    pos->columnNumber++;
  }
}